

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

string * __thiscall CLI::App::help(string *__return_storage_ptr__,App *this,size_t wid,string *prev)

{
  App *pAVar1;
  pointer pcVar2;
  pointer puVar3;
  Option *pOVar4;
  long lVar5;
  _Alloc_hider _Var6;
  _Base_ptr __n;
  pointer puVar7;
  ulong uVar8;
  size_t sVar9;
  int iVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  const_iterator cVar13;
  bool bVar14;
  bool bVar15;
  char *pcVar16;
  pointer puVar17;
  pointer puVar18;
  pointer puVar19;
  Option_p *opt;
  bool bVar20;
  bool bVar21;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subcmd_groups_seen;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  stringstream out;
  undefined1 local_3e0 [17];
  undefined7 uStack_3cf;
  undefined8 uStack_3c8;
  _Base_ptr local_3c0;
  size_t local_3b8;
  char *local_3b0;
  ulong local_3a8;
  char local_3a0;
  undefined7 uStack_39f;
  undefined1 *puStack_398;
  undefined1 *local_390;
  size_t local_388;
  undefined1 local_380;
  undefined7 uStack_37f;
  undefined8 uStack_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_370;
  size_t local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  key_type local_350;
  char *local_330;
  ulong local_328;
  char local_320;
  undefined7 uStack_31f;
  undefined1 *puStack_318;
  string *local_310;
  pointer local_308;
  string local_300;
  string local_2e0;
  undefined1 *local_2c0;
  size_t local_2b8;
  undefined1 local_2b0;
  undefined7 uStack_2af;
  undefined8 uStack_2a8;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_1d0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  if (prev->_M_string_length == 0) {
    ::std::__cxx11::string::_M_assign((string *)prev);
  }
  else {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     " ",&this->name_);
    ::std::__cxx11::string::_M_append((char *)prev,local_1b8._0_8_);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_);
    }
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            (&local_1d0,&this->parsed_subcommands_);
  if (local_1d0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1d0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),(this->description_)._M_dataplus._M_p,
                         (this->description_)._M_string_length);
    ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    ::std::ostream::put((char)poVar11);
    ::std::ostream::flush();
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"Usage: ",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),(prev->_M_dataplus)._M_p,prev->_M_string_length);
    local_200._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_200._M_impl.super__Rb_tree_header._M_header;
    local_200._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    bVar21 = false;
    local_200._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_200._M_impl.super__Rb_tree_header._M_node_count = 0;
    puVar17 = (this->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_200._M_impl.super__Rb_tree_header._M_header._M_right =
         local_200._M_impl.super__Rb_tree_header._M_header._M_left;
    if (puVar17 != puVar3) {
      bVar21 = false;
      do {
        pOVar4 = (puVar17->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        if (((long)*(pointer *)
                    ((long)&(pOVar4->lnames_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    + 8) -
             *(long *)&(pOVar4->lnames_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data >> 5) +
            ((long)*(pointer *)
                    ((long)&(pOVar4->snames_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    + 8) -
             *(long *)&(pOVar4->snames_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl >> 5) != 0) {
          bVar21 = true;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_200,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar4);
        }
        puVar17 = puVar17 + 1;
      } while (puVar17 != puVar3);
    }
    local_310 = __return_storage_ptr__;
    if (bVar21) {
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10)," [OPTIONS]",10);
    }
    puVar17 = (this->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar15 = false;
    if (puVar17 != puVar3) {
      bVar20 = false;
      do {
        bVar14 = bVar20;
        if ((((puVar17->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
              _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->pname_)._M_string_length !=
            0) {
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10)," ",1);
          Option::help_positional_abi_cxx11_
                    ((string *)local_3e0,
                     (puVar17->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),(char *)local_3e0._0_8_,local_3e0._8_8_);
          if ((undefined1 *)local_3e0._0_8_ != local_3e0 + 0x10) {
            operator_delete((void *)local_3e0._0_8_);
          }
          pOVar4 = (puVar17->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          if ((pOVar4->pname_)._M_string_length != 0) {
            bVar15 = true;
            bVar14 = true;
            if ((*(size_t *)((long)&(pOVar4->requires_)._M_t + 0x28) == 0 &&
                 (pOVar4->description_)._M_string_length == 0) &&
               (bVar15 = bVar20, bVar14 = bVar20,
               *(size_t *)((long)&(pOVar4->excludes_)._M_t + 0x28) != 0)) {
              bVar15 = true;
              bVar14 = bVar15;
            }
          }
        }
        puVar17 = puVar17 + 1;
        bVar20 = bVar14;
      } while (puVar17 != puVar3);
    }
    if ((this->subcommands_).
        super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->subcommands_).
        super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar20 = this->require_subcommand_min_ == 0;
      pcVar16 = " SUBCOMMAND";
      if (bVar20) {
        pcVar16 = " [SUBCOMMAND]";
      }
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),pcVar16,(ulong)bVar20 * 2 + 0xb);
    }
    ::std::ios::widen((char)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18) +
                      (char)local_1b8 + '\x10');
    ::std::ostream::put((char)local_1b8 + '\x10');
    ::std::ostream::flush();
    if (bVar15) {
      ::std::ios::widen((char)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18) +
                        (char)local_1b8 + '\x10');
      ::std::ostream::put((char)local_1b8 + '\x10');
      poVar11 = (ostream *)::std::ostream::flush();
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Positionals:",0xc);
      ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      ::std::ostream::put((char)poVar11);
      ::std::ostream::flush();
      puVar17 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->options_).
               super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar17 != puVar3) {
        do {
          pOVar4 = (puVar17->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          lVar5 = *(long *)&(pOVar4->super_OptionBase<CLI::Option>).group_;
          local_330 = &local_320;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_330,lVar5,
                     *(size_type *)((long)&(pOVar4->super_OptionBase<CLI::Option>).group_ + 8) +
                     lVar5);
          ::std::
          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                    (local_330,local_330 + local_328,local_330);
          uVar8 = local_328;
          if (local_330 == &local_320) {
            uStack_3c8 = puStack_318;
            local_3e0._0_8_ = local_3e0 + 0x10;
          }
          else {
            local_3e0._0_8_ = local_330;
          }
          uStack_3cf = uStack_31f;
          local_3e0[0x10] = local_320;
          local_3e0._8_8_ = local_328;
          local_328 = 0;
          local_320 = '\0';
          local_330 = &local_320;
          if ((undefined1 *)local_3e0._0_8_ != local_3e0 + 0x10) {
            operator_delete((void *)local_3e0._0_8_);
          }
          if (local_330 != &local_320) {
            operator_delete(local_330);
          }
          if (((uVar8 != 0) &&
              (pOVar4 = (puVar17->_M_t).
                        super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                        super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                        super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
              (pOVar4->pname_)._M_string_length != 0)) &&
             ((*(size_t *)((long)&(pOVar4->requires_)._M_t + 0x28) != 0 ||
               (pOVar4->description_)._M_string_length != 0 ||
              (*(size_t *)((long)&(pOVar4->excludes_)._M_t + 0x28) != 0)))) {
            Option::help_pname_abi_cxx11_(&local_240,pOVar4);
            pOVar4 = (puVar17->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
            local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
            _Var6._M_p = (pOVar4->description_)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_280,_Var6._M_p,
                       _Var6._M_p + (pOVar4->description_)._M_string_length);
            detail::format_help((stringstream *)local_1b8,&local_240,&local_280,wid);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p);
            }
          }
          puVar17 = puVar17 + 1;
        } while (puVar17 != puVar3);
      }
    }
    if ((bVar21) &&
       ((_Rb_tree_header *)local_200._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_200._M_impl.super__Rb_tree_header)) {
      p_Var12 = local_200._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_3b0 = &local_3a0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b0,*(long *)(p_Var12 + 1),
                   (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
        ::std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                  (local_3b0,local_3b0 + local_3a8,local_3b0);
        uVar8 = local_3a8;
        if (local_3b0 == &local_3a0) {
          uStack_3c8 = puStack_398;
          local_3e0._0_8_ = local_3e0 + 0x10;
        }
        else {
          local_3e0._0_8_ = local_3b0;
        }
        uStack_3cf = uStack_39f;
        local_3e0[0x10] = local_3a0;
        local_3e0._8_8_ = local_3a8;
        local_3a8 = 0;
        local_3a0 = '\0';
        local_3b0 = &local_3a0;
        if ((undefined1 *)local_3e0._0_8_ != local_3e0 + 0x10) {
          operator_delete((void *)local_3e0._0_8_);
        }
        if (local_3b0 != &local_3a0) {
          operator_delete(local_3b0);
        }
        if (uVar8 != 0) {
          ::std::ios::widen((char)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18) +
                            (char)local_1b8 + '\x10');
          ::std::ostream::put((char)local_1b8 + '\x10');
          poVar11 = (ostream *)::std::ostream::flush();
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,*(char **)(p_Var12 + 1),(long)p_Var12[1]._M_parent);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
          ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          ::std::ostream::put((char)poVar11);
          ::std::ostream::flush();
          puVar3 = (this->options_).
                   super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar17 = (this->options_).
                         super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar3;
              puVar17 = puVar17 + 1) {
            pOVar4 = (puVar17->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
            if (((((long)*(pointer *)
                          ((long)&(pOVar4->lnames_).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          + 8) -
                   (long)(pOVar4->lnames_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) +
                  ((long)*(pointer *)
                          ((long)&(pOVar4->snames_).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          + 8) -
                   (long)(pOVar4->snames_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) != 0) &&
                (__n = *(_Base_ptr *)((long)&(pOVar4->super_OptionBase<CLI::Option>).group_ + 8),
                __n == p_Var12[1]._M_parent)) &&
               ((__n == (_Base_ptr)0x0 ||
                (iVar10 = bcmp(*(void **)&(pOVar4->super_OptionBase<CLI::Option>).group_,
                               *(void **)(p_Var12 + 1),(size_t)__n), iVar10 == 0)))) {
              Option::help_name_abi_cxx11_(&local_260,pOVar4,true);
              pOVar4 = (puVar17->_M_t).
                       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
              local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
              _Var6._M_p = (pOVar4->description_)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2a0,_Var6._M_p,
                         _Var6._M_p + (pOVar4->description_)._M_string_length);
              detail::format_help((stringstream *)local_1b8,&local_260,&local_2a0,wid);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p);
              }
            }
          }
        }
        p_Var12 = (_Base_ptr)::std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != &local_200._M_impl.super__Rb_tree_header);
    }
    puVar18 = (this->subcommands_).
              super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_308 = (this->subcommands_).
                super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar18 != local_308) {
      uStack_3c8 = local_3e0 + 8;
      local_3e0._8_8_ = local_3e0._8_8_ & 0xffffffff00000000;
      stack0xfffffffffffffc30 = 0;
      local_3b8 = 0;
      local_3c0 = (_Base_ptr)uStack_3c8;
      do {
        pAVar1 = (puVar18->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>.
                 _M_t.super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                 super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
        _Var6._M_p = (pAVar1->group_)._M_dataplus._M_p;
        local_370 = &local_360;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_370,_Var6._M_p,_Var6._M_p + (pAVar1->group_)._M_string_length);
        ::std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                  (local_370,local_370->_M_local_buf + local_368,local_370);
        sVar9 = local_368;
        if (local_370 == &local_360) {
          local_350.field_2._8_8_ = local_360._8_8_;
          local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        }
        else {
          local_350._M_dataplus._M_p = (pointer)local_370;
        }
        local_350.field_2._M_allocated_capacity._1_7_ = local_360._M_allocated_capacity._1_7_;
        local_350.field_2._M_local_buf[0] = local_360._M_local_buf[0];
        local_350._M_string_length = local_368;
        local_368 = 0;
        local_360._M_local_buf[0] = '\0';
        local_370 = &local_360;
        if ((sVar9 != 0) &&
           (cVar13 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_3e0,&local_350), cVar13._M_node == (_Base_ptr)(local_3e0 + 8)))
        {
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_3e0,&local_350);
          ::std::ios::widen((char)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18) +
                            (char)local_1b8 + '\x10');
          ::std::ostream::put((char)local_1b8 + '\x10');
          poVar11 = (ostream *)::std::ostream::flush();
          pAVar1 = (puVar18->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>.
                   _M_t.super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                   super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(pAVar1->group_)._M_dataplus._M_p,
                               (pAVar1->group_)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
          ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          ::std::ostream::put((char)poVar11);
          ::std::ostream::flush();
          puVar7 = (this->subcommands_).
                   super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar19 = (this->subcommands_).
                         super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar7;
              puVar19 = puVar19 + 1) {
            pAVar1 = (puVar19->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>
                     ._M_t.super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                     super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
            _Var6._M_p = (pAVar1->group_)._M_dataplus._M_p;
            local_390 = &local_380;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_390,_Var6._M_p,
                       _Var6._M_p + (pAVar1->group_)._M_string_length);
            ::std::
            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                      (local_390,local_390 + local_388,local_390);
            sVar9 = local_388;
            if (local_390 == &local_380) {
              uStack_2a8 = uStack_378;
              local_2c0 = &local_2b0;
            }
            else {
              local_2c0 = local_390;
            }
            _local_2b0 = CONCAT71(uStack_37f,local_380);
            local_2b8 = local_388;
            local_388 = 0;
            local_380 = 0;
            if (sVar9 == local_350._M_string_length) {
              if (sVar9 == 0) {
                bVar21 = true;
                local_390 = &local_380;
              }
              else {
                local_390 = &local_380;
                iVar10 = bcmp(local_2c0,local_350._M_dataplus._M_p,sVar9);
                bVar21 = iVar10 == 0;
              }
            }
            else {
              bVar21 = false;
              local_390 = &local_380;
            }
            if (local_2c0 != &local_2b0) {
              operator_delete(local_2c0);
            }
            if (local_390 != &local_380) {
              operator_delete(local_390);
            }
            if (bVar21) {
              pAVar1 = (puVar19->_M_t).
                       super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                       super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
              local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
              _Var6._M_p = (pAVar1->name_)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_300,_Var6._M_p,
                         _Var6._M_p + (pAVar1->name_)._M_string_length);
              pAVar1 = (puVar19->_M_t).
                       super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                       super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
              local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
              _Var6._M_p = (pAVar1->description_)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2e0,_Var6._M_p,
                         _Var6._M_p + (pAVar1->description_)._M_string_length);
              detail::format_help((stringstream *)local_1b8,&local_300,&local_2e0,wid);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                operator_delete(local_2e0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_300._M_dataplus._M_p != &local_300.field_2) {
                operator_delete(local_300._M_dataplus._M_p);
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p);
        }
        puVar18 = puVar18 + 1;
      } while (puVar18 != local_308);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3e0);
    }
    if ((this->footer_)._M_string_length != 0) {
      ::std::ios::widen((char)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18) +
                        (char)local_1b8 + '\x10');
      ::std::ostream::put((char)local_1b8 + '\x10');
      poVar11 = (ostream *)::std::ostream::flush();
      poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(this->footer_)._M_dataplus._M_p,(this->footer_)._M_string_length
                          );
      ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      ::std::ostream::put((char)poVar11);
      ::std::ostream::flush();
    }
    ::std::__cxx11::stringbuf::str();
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_200);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    ::std::ios_base::~ios_base(local_138);
    __return_storage_ptr__ = local_310;
  }
  else {
    pAVar1 = *local_1d0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar2 = (prev->_M_dataplus)._M_p;
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_220,pcVar2,pcVar2 + prev->_M_string_length);
    help(__return_storage_ptr__,pAVar1,wid,&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
  }
  if (local_1d0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string help(size_t wid = 30, std::string prev = "") const {
        // Delegate to subcommand if needed
        if(prev.empty())
            prev = name_;
        else
            prev += " " + name_;

        auto selected_subcommands = get_subcommands();
        if(!selected_subcommands.empty())
            return selected_subcommands.at(0)->help(wid, prev);

        std::stringstream out;
        out << description_ << std::endl;
        out << "Usage: " << prev;

        // Check for options_
        bool npos = false;
        std::set<std::string> groups;
        for(const Option_p &opt : options_) {
            if(opt->nonpositional()) {
                npos = true;
                groups.insert(opt->get_group());
            }
        }

        if(npos)
            out << " [OPTIONS]";

        // Positionals
        bool pos = false;
        for(const Option_p &opt : options_)
            if(opt->get_positional()) {
                // A hidden positional should still show up in the usage statement
                // if(detail::to_lower(opt->get_group()).empty())
                //    continue;
                out << " " << opt->help_positional();
                if(opt->_has_help_positional())
                    pos = true;
            }

        if(!subcommands_.empty()) {
            if(require_subcommand_min_ > 0)
                out << " SUBCOMMAND";
            else
                out << " [SUBCOMMAND]";
        }

        out << std::endl;

        // Positional descriptions
        if(pos) {
            out << std::endl << "Positionals:" << std::endl;
            for(const Option_p &opt : options_) {
                if(detail::to_lower(opt->get_group()).empty())
                    continue; // Hidden
                if(opt->_has_help_positional())
                    detail::format_help(out, opt->help_pname(), opt->get_description(), wid);
            }
        }

        // Options
        if(npos) {
            for(const std::string &group : groups) {
                if(detail::to_lower(group).empty())
                    continue; // Hidden
                out << std::endl << group << ":" << std::endl;
                for(const Option_p &opt : options_) {
                    if(opt->nonpositional() && opt->get_group() == group)
                        detail::format_help(out, opt->help_name(true), opt->get_description(), wid);
                }
            }
        }

        // Subcommands
        if(!subcommands_.empty()) {
            std::set<std::string> subcmd_groups_seen;
            for(const App_p &com : subcommands_) {
                const std::string &group_key = detail::to_lower(com->get_group());
                if(group_key.empty() || subcmd_groups_seen.count(group_key) != 0)
                    continue; // Hidden or not in a group

                subcmd_groups_seen.insert(group_key);
                out << std::endl << com->get_group() << ":" << std::endl;
                for(const App_p &new_com : subcommands_)
                    if(detail::to_lower(new_com->get_group()) == group_key)
                        detail::format_help(out, new_com->get_name(), new_com->description_, wid);
            }
        }

        if(!footer_.empty()) {
            out << std::endl << footer_ << std::endl;
        }

        return out.str();
    }